

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,binary_expression *e)

{
  token_type tt;
  wostream *pwVar1;
  expression *e_00;
  int iVar2;
  wstring *pwVar3;
  char *pcVar4;
  
  iVar2 = operator_precedence(e->op_);
  print_with_parentheses
            (this,(e->lhs_)._M_t.
                  super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
                  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar2);
  tt = e->op_;
  pwVar1 = this->os_;
  if (tt != dot) {
    if (tt == lbracket) {
      std::operator<<(pwVar1,'[');
      accept<mjs::print_visitor>
                ((e->rhs_)._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
      std::operator<<(this->os_,']');
      return;
    }
    pcVar4 = op_text(tt);
    std::operator<<(pwVar1,pcVar4);
    print_with_parentheses
              (this,(e->rhs_)._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,iVar2);
    return;
  }
  std::operator<<(pwVar1,'.');
  iVar2 = (**(code **)((long)(((e->rhs_)._M_t.
                               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                               .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl)->
                             super_syntax_node)._vptr_syntax_node + 0x18))();
  e_00 = (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if ((iVar2 == 2) && (*(int *)&e_00[1].super_syntax_node._vptr_syntax_node == 4)) {
    pwVar1 = this->os_;
    pwVar3 = token::text_abi_cxx11_((token *)(e_00 + 1));
    std::operator<<(pwVar1,(wstring *)pwVar3);
    return;
  }
  accept<mjs::print_visitor>(e_00,this);
  return;
}

Assistant:

void operator()(const binary_expression& e) {
        const int precedence = operator_precedence(e.op());
        print_with_parentheses(e.lhs(), precedence);
        if (e.op() == token_type::lbracket) {
            os_ << '[';
            accept(e.rhs(), *this);
            os_ << ']';
        } else if (e.op() == token_type::dot) {
            os_ << '.';
            if (e.rhs().type() == expression_type::literal) {
                if (const auto& t = static_cast<const literal_expression&>(e.rhs()).t(); t.type() == token_type::string_literal) {
                    os_ << t.text();
                    return;
                }
            }
            accept(e.rhs(), *this);
        } else {
            os_ << op_text(e.op());
            print_with_parentheses(e.rhs(), precedence);
        }
    }